

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkSpeedup(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
              int fVeryVerbose)

{
  float *pfVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  long *plVar5;
  void *pvVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  Abc_Ntk_t *__s;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *vTimes;
  void **ppvVar10;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  Abc_Ntk_t *pAVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  Abc_Ntk_t *pAVar19;
  char *pcVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  size_t __size;
  long lVar25;
  float fVar26;
  float tDelta;
  
  fVar26 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  if (fUseLutLib == 0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar26) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar26,(double)tDelta);
    printf("Using %s model. ");
    if (fUseLutLib != 0) {
      printf("Percentage = %d. ");
    }
    putchar(10);
  }
  __size = (long)pNtk->vObjs->nSize << 2;
  __s = (Abc_Ntk_t *)malloc(__size);
  pAVar19 = __s;
  memset(__s,0,__size);
  pVVar11 = pNtk->vObjs;
  uVar12 = (ulong)(uint)pVVar11->nSize;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar11->pArray[lVar16];
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         (pAVar3->pNtk->pLutTimes[(long)pAVar3->Id * 3 + 2] < tDelta)) {
        uVar8 = Abc_NtkDelayTraceTCEdges(pAVar19,pAVar3,tDelta,fUseLutLib);
        __s->nObjCounts[(long)pAVar3->Id + -0x18] = uVar8;
      }
      lVar16 = lVar16 + 1;
      pVVar11 = pNtk->vObjs;
      uVar12 = (ulong)pVVar11->nSize;
    } while (lVar16 < (long)uVar12);
  }
  if (fVerbose != 0) {
    if ((int)uVar12 < 1) {
      uVar8 = 0;
      iVar22 = 0;
    }
    else {
      uVar15 = 0;
      iVar22 = 0;
      uVar8 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[uVar15];
        if ((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) {
          if (0 < (long)*(int *)((long)plVar4 + 0x1c)) {
            lVar16 = 0;
            do {
              plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[4] + lVar16 * 4) * 8);
              uVar18 = *(uint *)((long)plVar5 + 0x14) & 0xf;
              if (((uVar18 != 2) && (uVar18 != 5)) &&
                 (pfVar1 = (float *)(*(long *)(*plVar5 + 400) + 8 + (long)(int)plVar5[2] * 0xc),
                 *pfVar1 <= tDelta && tDelta != *pfVar1)) {
                uVar8 = uVar8 + 1;
              }
              lVar16 = lVar16 + 1;
            } while (*(int *)((long)plVar4 + 0x1c) != lVar16);
          }
          uVar18 = ((uint)__s->nObjCounts[(long)(int)plVar4[2] + -0x18] >> 1 & 0x55555555) +
                   (__s->nObjCounts[(long)(int)plVar4[2] + -0x18] & 0x55555555U);
          uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
          uVar18 = (uVar18 >> 4 & 0x7070707) + (uVar18 & 0x7070707);
          uVar18 = (uVar18 >> 8 & 0xf000f) + (uVar18 & 0xf000f);
          iVar22 = (uVar18 >> 0x10) + iVar22 + (uVar18 & 0xffff);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uVar12 & 0xffffffff));
    }
    uVar18 = Abc_NtkGetTotalFanins(pNtk);
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",
           (double)iVar22 / (double)(int)uVar8,(ulong)uVar18,(ulong)uVar8);
  }
  pAig = Abc_NtkStrash(pNtk,0,1,0);
  vTimes = (Vec_Ptr_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  vTimes->nSize = 0;
  ppvVar10 = (void **)malloc(0x80);
  vTimes->pArray = ppvVar10;
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 0x10;
  vLeaves->nSize = 0;
  pAVar19 = (Abc_Ntk_t *)0x80;
  ppvVar10 = (void **)malloc(0x80);
  uVar18 = 0;
  vLeaves->pArray = ppvVar10;
  pVVar11 = pNtk->vObjs;
  uVar8 = 0;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    uVar8 = 0;
    uVar18 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar11->pArray[lVar16];
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        if (pAVar3->pNtk->pLutTimes[(long)pAVar3->Id * 3 + 2] < tDelta) {
          pAVar13 = (Abc_Ntk_t *)(long)(pAVar3->vFanins).nSize;
          if ((long)pAVar13 < 1) {
            uVar23 = 0;
          }
          else {
            pAVar19 = (Abc_Ntk_t *)0x0;
            uVar23 = 0;
            do {
              uVar21 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                       [(pAVar3->vFanins).pArray[(long)pAVar19]] + 0x14) & 0xf;
              if ((uVar21 != 2) && (uVar21 != 5)) {
                uVar23 = uVar23 + (((uint)__s->nObjCounts[(long)pAVar3->Id + -0x18] >>
                                    ((uint)pAVar19 & 0x1f) & 1) != 0);
              }
              pAVar19 = (Abc_Ntk_t *)((long)&pAVar19->ntkType + 1);
            } while (pAVar13 != pAVar19);
          }
          if (fVeryVerbose != 0 || uVar23 != 0) {
            vTimes->nSize = 0;
            if ((uVar23 != 0) && (0 < (pAVar3->vFanins).nSize)) {
              lVar24 = 0;
              do {
                plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar24]];
                uVar21 = *(uint *)((long)plVar4 + 0x14) & 0xf;
                if ((((uVar21 != 2) && (uVar21 != 5)) &&
                    (((uint)__s->nObjCounts[(long)pAVar3->Id + -0x18] >> ((uint)lVar24 & 0x1f) & 1)
                     != 0)) && (0 < *(int *)((long)plVar4 + 0x1c))) {
                  lVar17 = 0;
                  do {
                    if (((uint)__s->nObjCounts[(long)(int)plVar4[2] + -0x18] >>
                         ((uint)lVar17 & 0x1f) & 1) != 0) {
                      pvVar6 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                         (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
                      uVar21 = vTimes->nSize;
                      lVar25 = (long)(int)uVar21;
                      if (0 < lVar25) {
                        lVar14 = 0;
                        do {
                          if (vTimes->pArray[lVar14] == pvVar6) goto LAB_00311d43;
                          lVar14 = lVar14 + 1;
                        } while (lVar25 != lVar14);
                      }
                      uVar9 = vTimes->nCap;
                      if (uVar21 == uVar9) {
                        if ((int)uVar9 < 0x10) {
                          pAVar19 = (Abc_Ntk_t *)vTimes->pArray;
                          if (pAVar19 == (Abc_Ntk_t *)0x0) {
                            pAVar19 = (Abc_Ntk_t *)0x80;
                            ppvVar10 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar10 = (void **)realloc(pAVar19,0x80);
                          }
                          iVar22 = 0x10;
                        }
                        else {
                          iVar22 = uVar9 * 2;
                          if (iVar22 <= (int)uVar9) goto LAB_00311d33;
                          pAVar13 = (Abc_Ntk_t *)vTimes->pArray;
                          pAVar19 = (Abc_Ntk_t *)((ulong)uVar9 << 4);
                          if (pAVar13 == (Abc_Ntk_t *)0x0) {
                            ppvVar10 = (void **)malloc((size_t)pAVar19);
                          }
                          else {
                            ppvVar10 = (void **)realloc(pAVar13,(size_t)pAVar19);
                            pAVar19 = pAVar13;
                          }
                        }
                        vTimes->pArray = ppvVar10;
                        vTimes->nCap = iVar22;
                      }
LAB_00311d33:
                      vTimes->nSize = uVar21 + 1;
                      vTimes->pArray[lVar25] = pvVar6;
                    }
LAB_00311d43:
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (pAVar3->vFanins).nSize);
            }
            uVar18 = uVar18 + 1;
            uVar21 = vTimes->nSize;
            if ((int)uVar21 <= Degree && uVar21 != 0) {
              vLeaves->nSize = 0;
              if (0 < (pAVar3->vFanins).nSize) {
                lVar24 = 0;
                do {
                  plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar24]];
                  uVar9 = *(uint *)((long)plVar4 + 0x14) & 0xf;
                  if ((uVar9 == 2) || (uVar9 == 5)) {
                    uVar9 = vLeaves->nSize;
                    lVar17 = (long)(int)uVar9;
                    if (0 < lVar17) {
                      lVar25 = 0;
                      do {
                        if ((long *)vLeaves->pArray[lVar25] == plVar4) goto LAB_00311f7a;
                        lVar25 = lVar25 + 1;
                      } while (lVar17 != lVar25);
                    }
                    uVar2 = vLeaves->nCap;
                    if (uVar9 == uVar2) {
                      if ((int)uVar2 < 0x10) {
                        pAVar19 = (Abc_Ntk_t *)vLeaves->pArray;
                        if (pAVar19 == (Abc_Ntk_t *)0x0) {
                          pAVar19 = (Abc_Ntk_t *)0x80;
                          ppvVar10 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar10 = (void **)realloc(pAVar19,0x80);
                        }
                        iVar22 = 0x10;
                      }
                      else {
                        iVar22 = uVar2 * 2;
                        if (iVar22 <= (int)uVar2) goto LAB_00311f6b;
                        pAVar13 = (Abc_Ntk_t *)vLeaves->pArray;
                        pAVar19 = (Abc_Ntk_t *)((ulong)uVar2 << 4);
                        if (pAVar13 == (Abc_Ntk_t *)0x0) {
                          ppvVar10 = (void **)malloc((size_t)pAVar19);
                        }
                        else {
                          ppvVar10 = (void **)realloc(pAVar13,(size_t)pAVar19);
                          pAVar19 = pAVar13;
                        }
                      }
                      vLeaves->pArray = ppvVar10;
                      vLeaves->nCap = iVar22;
                    }
LAB_00311f6b:
                    vLeaves->nSize = uVar9 + 1;
                    vLeaves->pArray[lVar17] = plVar4;
                  }
                  else if (0 < *(int *)((long)plVar4 + 0x1c)) {
                    uVar12 = (ulong)(uint)vLeaves->nSize;
                    lVar17 = 0;
                    do {
                      pvVar6 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                         (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
                      uVar9 = (uint)uVar12;
                      if (0 < (int)uVar9) {
                        uVar15 = 0;
                        do {
                          if (vLeaves->pArray[uVar15] == pvVar6) goto LAB_00311f00;
                          uVar15 = uVar15 + 1;
                        } while (uVar12 != uVar15);
                      }
                      uVar2 = vLeaves->nCap;
                      if (uVar9 == uVar2) {
                        if ((int)uVar2 < 0x10) {
                          pAVar19 = (Abc_Ntk_t *)vLeaves->pArray;
                          if (pAVar19 == (Abc_Ntk_t *)0x0) {
                            pAVar19 = (Abc_Ntk_t *)0x80;
                            ppvVar10 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar10 = (void **)realloc(pAVar19,0x80);
                          }
                          iVar22 = 0x10;
                        }
                        else {
                          iVar22 = uVar2 * 2;
                          if (iVar22 <= (int)uVar2) goto LAB_00311ef3;
                          pAVar13 = (Abc_Ntk_t *)vLeaves->pArray;
                          pAVar19 = (Abc_Ntk_t *)((ulong)uVar2 << 4);
                          if (pAVar13 == (Abc_Ntk_t *)0x0) {
                            ppvVar10 = (void **)malloc((size_t)pAVar19);
                          }
                          else {
                            ppvVar10 = (void **)realloc(pAVar13,(size_t)pAVar19);
                            pAVar19 = pAVar13;
                          }
                        }
                        vLeaves->pArray = ppvVar10;
                        vLeaves->nCap = iVar22;
                      }
LAB_00311ef3:
                      uVar12 = (ulong)(uVar9 + 1);
                      vLeaves->pArray[(int)uVar9] = pvVar6;
LAB_00311f00:
                      lVar17 = lVar17 + 1;
                    } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
                    vLeaves->nSize = (int)uVar12;
                  }
LAB_00311f7a:
                  lVar24 = lVar24 + 1;
                } while (lVar24 < (pAVar3->vFanins).nSize);
              }
              if (fVeryVerbose != 0) {
                printf("%5d Node %5d : %d %2d %2d  ",(ulong)uVar18,(ulong)(uint)pAVar3->Id,
                       (ulong)uVar23,(ulong)uVar21,(ulong)(uint)vLeaves->nSize);
                if (0 < (pAVar3->vFanins).nSize) {
                  lVar24 = 0;
                  do {
                    plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar24]];
                    lVar17 = (long)(int)plVar4[2];
                    pcVar20 = "*";
                    if (((uint)__s->nObjCounts[(long)pAVar3->Id + -0x18] >> ((uint)lVar24 & 0x1f) &
                        1) == 0) {
                      pcVar20 = "";
                    }
                    printf("%d(%.2f)%s ",
                           (double)*(float *)(*(long *)(*plVar4 + 400) + 8 + lVar17 * 0xc),lVar17,
                           pcVar20);
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < (pAVar3->vFanins).nSize);
                }
                pAVar19 = (Abc_Ntk_t *)0xa;
                putchar(10);
              }
              if (1 < (int)uVar21) {
                ppvVar10 = vTimes->pArray;
                plVar4 = (long *)*ppvVar10;
                plVar5 = (long *)ppvVar10[1];
                pAVar19 = (Abc_Ntk_t *)((long)(int)plVar4[2] * 3);
                fVar26 = *(float *)(*(long *)(*plVar5 + 400) + 8 + (long)(int)plVar5[2] * 0xc);
                pfVar1 = (float *)(*(long *)(*plVar4 + 400) + 8 + (long)(int)plVar4[2] * 0xc);
                if (*pfVar1 <= fVar26 && fVar26 != *pfVar1) {
                  *ppvVar10 = plVar5;
                  ppvVar10[1] = plVar4;
                }
              }
              if (2 < (int)uVar21) {
                ppvVar10 = vTimes->pArray;
                plVar4 = (long *)ppvVar10[1];
                plVar5 = (long *)ppvVar10[2];
                fVar26 = *(float *)(*(long *)(*plVar5 + 400) + 8 + (long)(int)plVar5[2] * 0xc);
                pfVar1 = (float *)(*(long *)(*plVar4 + 400) + 8 + (long)(int)plVar4[2] * 0xc);
                if (*pfVar1 <= fVar26 && fVar26 != *pfVar1) {
                  if ((int)uVar21 < 2) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                  }
                  ppvVar10[1] = plVar5;
                  ppvVar10[2] = plVar4;
                }
                if ((int)uVar21 < 2) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                plVar4 = (long *)*ppvVar10;
                plVar5 = (long *)ppvVar10[1];
                pAVar19 = (Abc_Ntk_t *)((long)(int)plVar4[2] * 3);
                fVar26 = *(float *)(*(long *)(*plVar5 + 400) + 8 + (long)(int)plVar5[2] * 0xc);
                pfVar1 = (float *)(*(long *)(*plVar4 + 400) + 8 + (long)(int)plVar4[2] * 0xc);
                if (*pfVar1 <= fVar26 && fVar26 != *pfVar1) {
                  *ppvVar10 = plVar5;
                  ppvVar10[1] = plVar4;
                }
              }
              uVar8 = uVar8 + 1;
              Abc_NtkSpeedupNode(pAVar19,pAig,pAVar3,vLeaves,vTimes);
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar16 < pVVar11->nSize);
  }
  if (vTimes->pArray != (void **)0x0) {
    free(vTimes->pArray);
    vTimes->pArray = (void **)0x0;
  }
  free(vTimes);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (__s != (Abc_Ntk_t *)0x0) {
    free(__s);
  }
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)(int)uVar8 / (double)(int)uVar18,(ulong)(uint)pNtk->nObjCounts[7],(ulong)uVar18,
           (ulong)uVar8);
  }
  pVVar11 = pAig->vObjs;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      puVar7 = (undefined8 *)pVVar11->pArray[lVar16];
      if (puVar7 != (undefined8 *)0x0) {
        if (((ulong)puVar7 & 1) != 0) {
          pcVar20 = "!Abc_ObjIsComplement(pNode)";
LAB_003122aa:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar7 != 3) {
          pcVar20 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_003122aa;
        }
        if (((*(int *)((long)puVar7 + 0x1c) == 2) && (puVar7[7] != 0)) &&
           (0 < *(int *)(puVar7[7] + 0x2c))) {
          puVar7[7] = 0;
        }
      }
      lVar16 = lVar16 + 1;
      pVVar11 = pAig->vObjs;
    } while (lVar16 < pVVar11->nSize);
  }
  return pAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puTCEdges;
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puTCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        puTCEdges[pNode->Id] = Abc_NtkDelayTraceTCEdges( pNtk, pNode, tDelta, fUseLutLib );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && Abc_ObjSlack(pFanin) < tDelta )
                    Counter++;
            CounterRes += Extra_WordCountOnes( puTCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Abc_NtkGetTotalFanins(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter );
    }
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puTCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, Abc_ObjSlack(pFanin), (puTCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    return pNtkNew;
}